

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t do_helper_oc(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src,uintptr_t ra
                     )

{
  byte bVar1;
  byte bVar2;
  int mmu_idx_00;
  uint size;
  undefined1 local_130 [7];
  uint8_t x;
  S390Access local_108;
  S390Access local_e0;
  byte local_b5;
  uint local_b4;
  undefined1 local_b0 [3];
  uint8_t c;
  uint32_t i;
  S390Access desta;
  S390Access srca2;
  S390Access srca1;
  int mmu_idx;
  uintptr_t ra_local;
  uint64_t src_local;
  uint64_t dest_local;
  uint32_t l_local;
  CPUS390XState_conflict *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  local_b5 = 0;
  size = l + 1;
  access_prepare(&local_e0,env,src,size,MMU_DATA_LOAD,mmu_idx_00,ra);
  memcpy(&srca2.size1,&local_e0,0x28);
  access_prepare(&local_108,env,dest,size,MMU_DATA_LOAD,mmu_idx_00,ra);
  memcpy(&desta.size1,&local_108,0x28);
  access_prepare((S390Access *)local_130,env,dest,size,MMU_DATA_STORE,mmu_idx_00,ra);
  memcpy(local_b0,local_130,0x28);
  for (local_b4 = 0; local_b4 < size; local_b4 = local_b4 + 1) {
    bVar1 = access_get_byte(env,(S390Access *)&srca2.size1,local_b4,ra);
    bVar2 = access_get_byte(env,(S390Access *)&desta.size1,local_b4,ra);
    local_b5 = local_b5 | bVar1 | bVar2;
    access_set_byte(env,(S390Access *)local_b0,local_b4,bVar1 | bVar2,ra);
  }
  return (uint32_t)(local_b5 != 0);
}

Assistant:

static uint32_t do_helper_oc(CPUS390XState *env, uint32_t l, uint64_t dest,
                             uint64_t src, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    S390Access srca1, srca2, desta;
    uint32_t i;
    uint8_t c = 0;

    HELPER_LOG("%s l %d dest %" PRIx64 " src %" PRIx64 "\n",
               __func__, l, dest, src);

    /* OC always processes one more byte than specified - maximum is 256 */
    l++;

    srca1 = access_prepare(env, src, l, MMU_DATA_LOAD, mmu_idx, ra);
    srca2 = access_prepare(env, dest, l, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, l, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < l; i++) {
        const uint8_t x = access_get_byte(env, &srca1, i, ra) |
                          access_get_byte(env, &srca2, i, ra);

        c |= x;
        access_set_byte(env, &desta, i, x, ra);
    }
    return c != 0;
}